

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O3

void __thiscall re2c::Binary::Binary(Binary *this,Span *s,uint32_t n,State *next)

{
  uint32_t uVar1;
  State *next_00;
  Cond *pCVar2;
  If *pIVar3;
  uint nsp;
  long *local_58;
  long local_50;
  long local_48 [2];
  State *local_38;
  
  this->cond = (Cond *)0x0;
  this->thn = (If *)0x0;
  this->els = (If *)0x0;
  local_38 = next;
  pCVar2 = (Cond *)operator_new(0x28);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<=","");
  nsp = n >> 1;
  uVar1 = s[nsp - 1].ub;
  (pCVar2->compare)._M_dataplus._M_p = (pointer)&(pCVar2->compare).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pCVar2,local_58,local_50 + (long)local_58);
  pCVar2->value = uVar1 - 1;
  this->cond = pCVar2;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pIVar3 = (If *)operator_new(0x10);
  next_00 = local_38;
  If::If(pIVar3,(uint)(n < 10),s,nsp,local_38);
  this->thn = pIVar3;
  pIVar3 = (If *)operator_new(0x10);
  If::If(pIVar3,(uint)(n - nsp < 5),s + nsp,n - nsp,next_00);
  this->els = pIVar3;
  return;
}

Assistant:

Binary::Binary (const Span * s, uint32_t n, const State * next)
	: cond (NULL)
	, thn (NULL)
	, els (NULL)
{
	const uint32_t l = n / 2;
	const uint32_t h = n - l;
	cond = new Cond ("<=", s[l - 1].ub - 1);
	thn = new If (l > 4 ? If::BINARY : If::LINEAR, &s[0], l, next);
	els = new If (h > 4 ? If::BINARY : If::LINEAR, &s[l], h, next);
}